

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob)

{
  uint uVar1;
  int iVar2;
  Layer *pLVar3;
  int k;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int i_1;
  uint uVar16;
  int _w;
  int iVar17;
  void *pvVar18;
  ulong uVar19;
  float fVar20;
  void *local_568;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat weights [2];
  Mat bottom_blob_bordered;
  
  if (this->kernel_h == 1 && (this->kernel_w == 1 && bottom_blob->dims == 1)) {
    iVar15 = bottom_blob->w;
    if (iVar15 == this->weight_data_size / this->num_output) {
      pLVar3 = create_layer(0xf);
      ParamDict::ParamDict((ParamDict *)&bottom_blob_bordered);
      ParamDict::set((ParamDict *)&bottom_blob_bordered,0,this->num_output);
      ParamDict::set((ParamDict *)&bottom_blob_bordered,1,this->bias_term);
      ParamDict::set((ParamDict *)&bottom_blob_bordered,2,this->weight_data_size);
      (*pLVar3->_vptr_Layer[2])(pLVar3,&bottom_blob_bordered);
      weights[1].h = 0;
      weights[1].c = 0;
      weights[1].cstep = 0;
      weights[1].elemsize = 0;
      weights[1].dims = 0;
      weights[1].w = 0;
      weights[1].data = (void *)0x0;
      weights[1].refcount = (int *)0x0;
      weights[0].h = 0;
      weights[0].c = 0;
      weights[0].cstep = 0;
      weights[0].elemsize = 0;
      weights[0].dims = 0;
      weights[0].w = 0;
      weights[0].data = (void *)0x0;
      weights[0].refcount = (int *)0x0;
      Mat::operator=(weights,&this->weight_data);
      Mat::operator=(weights + 1,&this->bias_data);
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&_space_ofs,weights);
      (*pLVar3->_vptr_Layer[3])(pLVar3,&_space_ofs);
      (*pLVar3->_vptr_Layer[5])(pLVar3,bottom_blob,top_blob);
      (*pLVar3->_vptr_Layer[1])(pLVar3);
      lVar9 = 0x30;
      do {
        Mat::~Mat((Mat *)((long)&weights[0].data + lVar9));
        lVar9 = lVar9 + -0x30;
      } while (lVar9 != -0x30);
      ParamDict::~ParamDict((ParamDict *)&bottom_blob_bordered);
      return 0;
    }
  }
  else {
    iVar15 = bottom_blob->w;
  }
  iVar17 = bottom_blob->h;
  uVar16 = (this->kernel_w + -1) * this->dilation_w;
  uVar1 = bottom_blob->c;
  uVar14 = (this->kernel_h + -1) * this->dilation_h;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  iVar4 = this->pad_w;
  iVar13 = this->pad_h;
  if (iVar13 < 1 && iVar4 < 1) {
    if (iVar13 == -0xe9 && iVar4 == -0xe9) {
      iVar13 = uVar16 - (iVar15 + -1) % this->stride_w;
      iVar4 = uVar14 - (iVar17 + -1) % this->stride_h;
      if ((0 < iVar13) ||
         (iVar15 = bottom_blob_bordered.w, iVar17 = bottom_blob_bordered.h, 0 < iVar4)) {
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar4 / 2,iVar4 - iVar4 / 2,iVar13 / 2,
                         iVar13 - iVar13 / 2,0,0.0);
        goto LAB_00124855;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&bottom_blob_bordered,iVar13,iVar13,iVar4,iVar4,0,0.0);
LAB_00124855:
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar15 = bottom_blob_bordered.w, iVar17 = bottom_blob_bordered.h,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) {
      iVar17 = -100;
      goto LAB_00124c03;
    }
  }
  iVar4 = (int)(~uVar16 + iVar15) / this->stride_w;
  iVar13 = (int)(~uVar14 + iVar17) / this->stride_h;
  _w = iVar4 + 1;
  Mat::create(top_blob,_w,iVar13 + 1,this->num_output,4);
  iVar17 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar14 = this->kernel_w * this->kernel_h;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(long)(int)uVar14,(allocator_type *)weights);
    iVar17 = this->dilation_h;
    iVar2 = this->kernel_w;
    iVar5 = this->dilation_w * iVar2;
    lVar9 = 0;
    iVar7 = 0;
    for (iVar11 = 0; iVar11 < this->kernel_h; iVar11 = iVar11 + 1) {
      for (lVar12 = 0; (int)lVar12 < iVar2; lVar12 = lVar12 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar9 + lVar12] = iVar7;
        iVar7 = iVar7 + this->dilation_w;
        iVar2 = this->kernel_w;
      }
      iVar7 = iVar7 + (iVar15 * iVar17 - iVar5);
      lVar9 = (int)lVar9 + lVar12;
    }
    iVar15 = 0;
    uVar19 = 0;
    if (0 < (int)uVar14) {
      uVar19 = (ulong)uVar14;
    }
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (lVar9 = 0; lVar9 < this->num_output; lVar9 = lVar9 + 1) {
      Mat::channel(weights,top_blob,(int)lVar9);
      local_568 = weights[0].data;
      Mat::~Mat(weights);
      for (iVar17 = 0; iVar17 <= iVar13; iVar17 = iVar17 + 1) {
        for (lVar12 = 0; lVar12 <= iVar4; lVar12 = lVar12 + 1) {
          if (this->bias_term == 0) {
            fVar20 = 0.0;
          }
          else {
            fVar20 = *(float *)((long)(this->bias_data).data + lVar9 * 4);
          }
          pvVar18 = (void *)((long)(this->weight_data).data + (long)iVar15 * 4);
          for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
            weights[0].data =
                 (void *)(bottom_blob_bordered.cstep * uVar10 * bottom_blob_bordered.elemsize +
                         (long)bottom_blob_bordered.data);
            weights[0].refcount = (int *)0x0;
            weights[0].elemsize = bottom_blob_bordered.elemsize;
            weights[0].w = bottom_blob_bordered.w;
            weights[0].dims = 2;
            weights[0].c = 1;
            weights[0].h = bottom_blob_bordered.h;
            weights[0].cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            for (uVar6 = 0; uVar19 != uVar6; uVar6 = uVar6 + 1) {
              fVar20 = fVar20 + *(float *)((long)pvVar18 + uVar6 * 4) *
                                *(float *)((long)weights[0].data +
                                          (long)_space_ofs.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar6] * 4
                                          + (long)this->stride_w * (long)(int)lVar12 * 4 +
                                            (long)(bottom_blob_bordered.w * iVar17 * this->stride_h)
                                            * 4);
            }
            Mat::~Mat(weights);
            pvVar18 = (void *)((long)pvVar18 + (long)(int)uVar14 * 4);
          }
          *(float *)((long)local_568 + lVar12 * 4) = fVar20;
        }
        local_568 = (void *)((long)local_568 + (long)_w * 4);
      }
      iVar15 = iVar15 + uVar1 * uVar14;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    iVar17 = 0;
  }
LAB_00124c03:
  Mat::~Mat(&bottom_blob_bordered);
  return iVar17;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}